

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::ArchiveOUT(ChMatterSPH *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChContinuumSPH> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChMatterSPH>(marchive);
  ChIndexedNodes::ArchiveOUT(&this->super_ChIndexedNodes,marchive);
  local_38._value = &this->material;
  local_38._name = "material";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChContinuumSPH>(marchive,&local_38);
  local_38._value = (ChContinuumSPH *)&this->matsurface;
  local_38._name = "matsurface";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChMaterialSurface>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChMaterialSurface>_> *)&local_38);
  local_38._value = (ChContinuumSPH *)&this->do_collide;
  local_38._name = "do_collide";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = (ChContinuumSPH *)&this->nodes;
  local_38._name = "nodes";
  local_38._flags = '\0';
  ChArchiveOut::out<std::shared_ptr<chrono::ChNodeSPH>>
            (marchive,(ChNameValue<std::vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>_>
                       *)&local_38);
  return;
}

Assistant:

void ChMatterSPH::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMatterSPH>();

    // serialize parent class
    ChIndexedNodes::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(material);
    marchive << CHNVP(matsurface);
    marchive << CHNVP(do_collide);
    marchive << CHNVP(nodes);
}